

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void connection_set_trace(CONNECTION_HANDLE connection,_Bool trace_on)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  _Bool trace_on_local;
  CONNECTION_HANDLE connection_local;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_set_trace",0x847,1,"NULL connection");
    }
  }
  else {
    connection->field_0xe0 = connection->field_0xe0 & 0xf7 | trace_on << 3;
  }
  return;
}

Assistant:

void connection_set_trace(CONNECTION_HANDLE connection, bool trace_on)
{
    /* Codes_S_R_S_CONNECTION_07_002: [If connection is NULL then connection_set_trace shall do nothing.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_07_001: [connection_set_trace shall set the ability to turn on and off trace logging.] */
        connection->is_trace_on = trace_on ? 1 : 0;
    }
}